

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O0

jstring Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1output_1get
                  (JNIEnv *jenv,jclass jcls,jlong jarg1,jobject jarg1_)

{
  JNIEnv_ *in_RDX;
  char *result;
  opt_s *arg1;
  jstring jresult;
  jstring local_28;
  
  local_28 = (jstring)0x0;
  if (in_RDX[2].functions != (JNINativeInterface_ *)0x0) {
    local_28 = JNIEnv_::NewStringUTF(in_RDX,(char *)in_RDX[2].functions);
  }
  return local_28;
}

Assistant:

SWIGEXPORT jstring JNICALL Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1output_1get(JNIEnv *jenv, jclass jcls, jlong jarg1, jobject jarg1_) {
  jstring jresult = 0 ;
  opt_s *arg1 = (opt_s *) 0 ;
  char *result = 0 ;
  
  (void)jenv;
  (void)jcls;
  (void)jarg1_;
  arg1 = *(opt_s **)&jarg1; 
  result = (char *) ((arg1)->output);
  if (result) jresult = jenv->NewStringUTF((const char *)result);
  return jresult;
}